

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O2

void __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
::
Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
::set_simplex(Simplex_coboundary_enumerator_<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Tag_sparse>
              *this,diameter_entry_t _simplex,dimension_t _dim)

{
  undefined1 idx [16];
  int iVar1;
  ulong uVar2;
  byte bVar3;
  undefined7 in_register_00000031;
  size_type __new_size;
  undefined8 in_stack_ffffffffffffffd0;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>
  local_28 [8];
  pointer local_20;
  
  *(undefined8 *)&this->idx_below =
       (undefined8)
       _simplex.
       super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
       .second.index;
  *(undefined8 *)((long)&this->idx_below + 8) =
       _simplex.
       super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
       .second.index._8_8_;
  *(undefined8 *)&this->idx_above = 0;
  *(undefined8 *)((long)&this->idx_above + 8) = 0;
  iVar1 = (int)CONCAT71(in_register_00000031,_dim) + 1;
  this->k = (dimension_t)iVar1;
  (this->simplex).
  super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
  .first = _simplex.
           super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
           .first;
  *(undefined8 *)
   &(this->simplex).
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
    .second.index =
       (undefined8)
       _simplex.
       super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
       .second.index;
  *(undefined8 *)
   ((long)&(this->simplex).
           super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
           .second.index + 8) =
       _simplex.
       super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
       .second.index._8_8_;
  __new_size = (size_type)iVar1;
  std::vector<int,_std::allocator<int>_>::resize(&this->vertices,__new_size);
  local_20 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  idx._8_8_ = in_stack_ffffffffffffffd0;
  idx._0_8_ = &local_20;
  Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>
  ::
  get_simplex_vertices<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
            (local_28,(simplex_t)idx,(dimension_t)this->parent,(vertex_t)(long)this->idx_below,
             *(reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
               **)((long)&this->idx_below + 8));
  std::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
  ::resize(&this->neighbor_it,__new_size);
  std::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
  ::resize(&this->neighbor_end,__new_size);
  bVar3 = _dim + 1;
  uVar2 = 0;
  if ((char)bVar3 < '\x01') {
    bVar3 = 0;
  }
  for (; bVar3 != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar2];
    (this->neighbor_it).
    super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar2].current._M_current =
         *(pointer *)
          ((long)&(this->dist->neighbors).
                  super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar1].
                  super__Vector_base<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>
                  ._M_impl + 8);
    (this->neighbor_end).
    super__Vector_base<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>,_std::allocator<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t_*,_std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar2].current._M_current =
         (this->dist->neighbors).
         super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[iVar1].
         super__Vector_base<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  return;
}

Assistant:

void set_simplex(const diameter_entry_t _simplex, const dimension_t _dim) {
      idx_below = parent.get_index(_simplex);
      idx_above = 0;
      k = _dim + 1;
      simplex = _simplex;
      vertices.resize(_dim + 1);
      parent.get_simplex_vertices(idx_below, _dim, dist.size(), vertices.rbegin());

      neighbor_it.resize(_dim + 1);
      neighbor_end.resize(_dim + 1);
      for (dimension_t i = 0; i <= _dim; ++i) {
        auto v = vertices[i];
        neighbor_it[i] = dist.neighbors[v].rbegin();
        neighbor_end[i] = dist.neighbors[v].rend();
      }
    }